

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSerializeEngine.cpp
# Opt level: O0

ssize_t __thiscall
xercesc_4_0::XSerializeEngine::read(XSerializeEngine *this,int __fd,void *__buf,size_t __nbytes)

{
  XSerializeEngine *extraout_RAX;
  XMLByte *__n;
  XSerializeEngine *pXVar1;
  undefined4 in_register_00000034;
  void *ptr;
  XSerializeEngine *local_38;
  XMLSize_t readRemain;
  XMLByte *tempRead;
  XMLSize_t dataAvail;
  XMLSize_t readLen_local;
  XMLByte *toRead_local;
  XSerializeEngine *this_local;
  
  ptr = (void *)CONCAT44(in_register_00000034,__fd);
  ensureLoading(this);
  ensurePointer(this,ptr);
  ensureLoadBuffer(this);
  pXVar1 = extraout_RAX;
  if (__buf != (void *)0x0) {
    __n = this->fBufLoadMax + -(long)this->fBufCur;
    if (__n < __buf) {
      memcpy(ptr,this->fBufCur,(size_t)__n);
      readRemain = (XMLSize_t)(__n + (long)ptr);
      for (local_38 = (XSerializeEngine *)((long)__buf - (long)__n);
          (XSerializeEngine *)this->fBufSize <= local_38;
          local_38 = (XSerializeEngine *)((long)local_38 - this->fBufSize)) {
        fillBuffer(this);
        memcpy((void *)readRemain,this->fBufCur,this->fBufSize);
        readRemain = this->fBufSize + readRemain;
      }
      pXVar1 = local_38;
      if (local_38 != (XSerializeEngine *)0x0) {
        fillBuffer(this);
        memcpy((void *)readRemain,this->fBufCur,(size_t)local_38);
        this->fBufCur = this->fBufCur + (long)&local_38->fStoreLoad;
        pXVar1 = this;
      }
    }
    else {
      memcpy(ptr,this->fBufCur,(size_t)__buf);
      this->fBufCur = (XMLByte *)((long)__buf + (long)this->fBufCur);
      pXVar1 = this;
    }
  }
  return (ssize_t)pXVar1;
}

Assistant:

void XSerializeEngine::read(XMLByte* const toRead
                          , XMLSize_t      readLen)
{
    ensureLoading();
    ensurePointer(toRead);
    ensureLoadBuffer();

    if (readLen == 0)
        return;

    /***
     *  If unread is sufficient, read it up
     ***/
    XMLSize_t dataAvail = fBufLoadMax - fBufCur;

    if (readLen <= dataAvail)
    {
        memcpy(toRead, fBufCur, readLen);
        fBufCur += readLen;
        return;
    }

    /***
     *
     * fillBuffer will discard anything left in the buffer
     * before it asks the inputStream to fill in the buffer,
     * so we need to readup everything in the buffer before
     * calling fillBuffer
     *
     ***/
    XMLByte*     tempRead   = (XMLByte*) toRead;
    XMLSize_t    readRemain = readLen;

    // read the unread
    memcpy(tempRead, fBufCur, dataAvail);
    tempRead   += dataAvail;
    readRemain -= dataAvail;

    // read chunks of fBufSize
    while (readRemain >= fBufSize)
    {
        fillBuffer();
        memcpy(tempRead, fBufCur, fBufSize);
        tempRead   += fBufSize;
        readRemain -= fBufSize;
    }

    // read the remaining if any
    if (readRemain)
    {
        fillBuffer();
        memcpy(tempRead, fBufCur, readRemain);
        fBufCur += readRemain;
    }

}